

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cc
# Opt level: O3

Field * google::protobuf::util::converter::FindFieldInTypeByNumberOrNull(Type *type,int32 number)

{
  Type *pTVar1;
  int index;
  
  if ((type != (Type *)0x0) && (0 < (type->fields_).super_RepeatedPtrFieldBase.current_size_)) {
    index = 0;
    do {
      pTVar1 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::Field>::TypeHandler>
                         (&(type->fields_).super_RepeatedPtrFieldBase,index);
      if (pTVar1->number_ == number) {
        return pTVar1;
      }
      index = index + 1;
    } while (index < (type->fields_).super_RepeatedPtrFieldBase.current_size_);
  }
  return (Field *)0x0;
}

Assistant:

const google::protobuf::Field* FindFieldInTypeByNumberOrNull(
    const google::protobuf::Type* type, int32 number) {
  if (type != nullptr) {
    for (int i = 0; i < type->fields_size(); ++i) {
      const google::protobuf::Field& field = type->fields(i);
      if (field.number() == number) {
        return &field;
      }
    }
  }
  return nullptr;
}